

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O2

void __thiscall avro::ArraySkipper::parse(ArraySkipper *this,Reader *reader,uint8_t *address)

{
  element_type *peVar1;
  int64_t iVar2;
  int64_t size;
  long lVar3;
  bool bVar4;
  
  do {
    iVar2 = ReaderImpl<avro::NullValidator>::readSize(reader);
    lVar3 = 0;
    if (0 < iVar2) {
      lVar3 = iVar2;
    }
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      peVar1 = (this->resolver_).px;
      (**peVar1->_vptr_Resolver)(peVar1,reader,address);
    }
  } while (iVar2 != 0);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        DEBUG_OUT("Skipping array");

        int64_t size = 0;
        do {
            size = reader.readArrayBlockSize();
            for(int64_t i = 0; i < size; ++i) {
                resolver_->parse(reader, address);
            }
        } while (size != 0);
    }